

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::WriteModelItem(MemoryWriter *wrt,LinTerms *lt,ItemNamer *vnam)

{
  size_t sVar1;
  char *in_RDX;
  LinTerms *in_RDI;
  double dVar2;
  size_t unaff_retaddr;
  ItemNamer *in_stack_00000008;
  double abscoef;
  bool ifpos;
  double coef;
  int i;
  char *in_stack_ffffffffffffff68;
  char value;
  LinTerms *in_stack_ffffffffffffff70;
  LinTerms *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar3;
  BasicStringRef<char> in_stack_ffffffffffffff98;
  int local_1c;
  
  local_1c = 0;
  while (iVar3 = local_1c, sVar1 = LinTerms::size((LinTerms *)0x704f5c), iVar3 < (int)sVar1) {
    dVar2 = LinTerms::coef(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    if (local_1c == 0) {
      if (dVar2 < 0.0) {
        fmt::BasicStringRef<char>::BasicStringRef
                  ((BasicStringRef<char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        fmt::BasicWriter<char>::operator<<
                  ((BasicWriter<char> *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff98);
      }
      value = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
    }
    else {
      in_stack_ffffffffffffff88 = in_RDI;
      fmt::BasicStringRef<char>::BasicStringRef
                ((BasicStringRef<char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      value = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
      fmt::BasicWriter<char>::operator<<
                ((BasicWriter<char> *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff98);
    }
    if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
      fmt::BasicWriter<char>::operator<<
                ((BasicWriter<char> *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
                 (double)in_stack_ffffffffffffff88);
      fmt::BasicWriter<char>::operator<<((BasicWriter<char> *)in_stack_ffffffffffffff70,value);
    }
    in_stack_ffffffffffffff68 = in_RDX;
    in_stack_ffffffffffffff70 = in_RDI;
    LinTerms::var(in_RDI,(size_t)in_RDX);
    ItemNamer::at(in_stack_00000008,unaff_retaddr);
    fmt::BasicStringRef<char>::BasicStringRef
              ((BasicStringRef<char> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    fmt::BasicWriter<char>::operator<<
              ((BasicWriter<char> *)CONCAT44(iVar3,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff98);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void WriteModelItem(fmt::MemoryWriter& wrt, const LinTerms& lt,
                    ItemNamer& vnam) {
  for (int i=0; i<(int)lt.size(); ++i) {
    auto coef = lt.coef(i);
    bool ifpos = coef>=0.0;
    if (i) {
      wrt << (ifpos ? " + " : " - ");
    } else {
      if (!ifpos)
        wrt << "-";
    }
    auto abscoef = std::fabs(coef);
    if (1.0 != abscoef)
      wrt << abscoef << '*';
    wrt << vnam.at(lt.var(i));
  }
}